

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalisation.cpp
# Opt level: O1

UnitList * __thiscall Shell::Normalisation::normalise(Normalisation *this,UnitList *units)

{
  List<Kernel::Unit_*> **ppLVar1;
  long lVar2;
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  __first;
  iterator __last;
  List<Kernel::Unit_*> *pLVar3;
  ulong uVar4;
  UnitList *pUVar5;
  List<Kernel::Unit_*> *current;
  uint len;
  uint uVar6;
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  __i;
  long lVar8;
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  __last_00;
  UnitList *pUVar9;
  vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> srt;
  Unit *unit;
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  local_58;
  iterator iStack_50;
  Unit **local_48;
  Unit *local_38;
  uint uVar7;
  
  if (units == (UnitList *)0x0) {
    pUVar5 = (UnitList *)0x0;
  }
  else {
    SymCounter::count(&this->_counter,units,1);
    pLVar3 = units;
    uVar6 = 0;
    do {
      uVar7 = uVar6;
      uVar6 = uVar7 + 1;
      pLVar3 = pLVar3->_tail;
    } while (pLVar3 != (List<Kernel::Unit_*> *)0x0);
    local_58._M_current = (Unit **)0x0;
    iStack_50._M_current = (Unit **)0x0;
    local_48 = (Unit **)0x0;
    pLVar3 = units;
    do {
      local_38 = pLVar3->_head;
      pLVar3 = pLVar3->_tail;
      normalise(this,local_38);
      if (iStack_50._M_current == local_48) {
        std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>::
        _M_realloc_insert<Kernel::Unit*const&>
                  ((vector<Kernel::Unit*,std::allocator<Kernel::Unit*>> *)&local_58,iStack_50,
                   &local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      __last._M_current = iStack_50._M_current;
      __first._M_current = local_58._M_current;
    } while (pLVar3 != (List<Kernel::Unit_*> *)0x0);
    if (local_58._M_current != iStack_50._M_current) {
      lVar8 = (long)iStack_50._M_current - (long)local_58._M_current;
      uVar4 = lVar8 >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Kernel::Unit**,std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Shell::Normalisation::normalise(Lib::List<Kernel::Unit*>*)::__0>>
                (local_58,(__normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
                           )iStack_50._M_current,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Shell_Normalisation_cpp:72:5)>
                  )this);
      if (lVar8 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Kernel::Unit**,std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Shell::Normalisation::normalise(Lib::List<Kernel::Unit*>*)::__0>>
                  (__first,(__normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
                            )__last._M_current,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Shell_Normalisation_cpp:72:5)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Kernel::Unit**,std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Shell::Normalisation::normalise(Lib::List<Kernel::Unit*>*)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Shell_Normalisation_cpp:72:5)>
                    )this);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Kernel::Unit**,std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>>,__gnu_cxx::__ops::_Val_comp_iter<Shell::Normalisation::normalise(Lib::List<Kernel::Unit*>*)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Shell_Normalisation_cpp:72:5)>
                      )this);
        }
      }
    }
    if ((int)uVar7 < 0) {
      pUVar5 = (UnitList *)0x0;
    }
    else {
      uVar4 = (ulong)uVar7;
      pUVar9 = (UnitList *)0x0;
      do {
        pUVar5 = (UnitList *)
                 ::Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        pUVar5->_head = local_58._M_current[uVar4];
        pUVar5->_tail = pUVar9;
        uVar6 = uVar6 - 1;
        uVar4 = uVar4 - 1;
        pUVar9 = pUVar5;
      } while (0 < (int)uVar6);
    }
    do {
      ppLVar1 = &units->_tail;
      if (units != (UnitList *)0x0) {
        units->_head = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = units;
      }
      units = *ppLVar1;
    } while (*ppLVar1 != (List<Kernel::Unit_*> *)0x0);
    if (local_58._M_current != (Unit **)0x0) {
      operator_delete(local_58._M_current,(long)local_48 - (long)local_58._M_current);
    }
  }
  return pUVar5;
}

Assistant:

UnitList* Normalisation::normalise (UnitList* units)
{
  if (UnitList::isEmpty(units)) {
    return units;
  }
  _counter.count(units,1);

  unsigned length = UnitList::length(units);

  // more than one literal
  std::vector<Unit *> srt;
  UnitList::Iterator us(units);
  while (us.hasNext()) {
    Unit* unit = us.next();
    normalise(unit);
    srt.push_back(unit);
  }
  sort(
    srt.begin(), srt.end(),
    [this](Unit *u1, Unit *u2) -> bool { return lessThan(u1, u2); }
  );
  UnitList* result = UnitList::empty();
  for (int k = length-1;k >= 0;k--) {
    result = new UnitList(srt[k],result);
  }
  UnitList::destroy(units);
  return result;
}